

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<Object_Lifetime_Vector2<float>_(),_Object_Lifetime_Vector2<float>_(*)()>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<Object_Lifetime_Vector2<float>_(),_Object_Lifetime_Vector2<float>_(*)()>
           *this,_func_Object_Lifetime_Vector2<float> *f)

{
  _func_Object_Lifetime_Vector2<float> *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::build_param_type_list<Object_Lifetime_Vector2<float>>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  Catch::clara::std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
  ~_Vector_base(&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_0069c838;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }